

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O0

void to_suite::convert_null(void)

{
  bool bVar1;
  type_info *this;
  any local_40;
  any result;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&result);
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_40,(basic_variable<std::allocator<char>_> *)&result);
  bVar1 = boost::any::empty(&local_40);
  boost::detail::test_impl
            ("result.empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x164,"void to_suite::convert_null()",bVar1);
  this = boost::any::type(&local_40);
  bVar1 = std::type_info::operator==(this,(type_info *)&void::typeinfo);
  boost::detail::test_impl
            ("result.type() == typeid(void)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x165,"void to_suite::convert_null()",bVar1);
  boost::any::~any(&local_40);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result);
  return;
}

Assistant:

void convert_null()
{
    variable data;
    auto result = convert::into<boost::any>(data);
    TRIAL_PROTOCOL_TEST(result.empty());
    TRIAL_PROTOCOL_TEST(result.type() == typeid(void));
}